

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O0

string * __thiscall
cmQtAutoGenerators::ChecksumedPath
          (string *__return_storage_ptr__,cmQtAutoGenerators *this,string *sourceFile,
          string *basePrefix,string *baseSuffix)

{
  string local_68;
  undefined1 local_31;
  string *local_30;
  string *baseSuffix_local;
  string *basePrefix_local;
  string *sourceFile_local;
  cmQtAutoGenerators *this_local;
  string *res;
  
  local_31 = 0;
  local_30 = baseSuffix;
  baseSuffix_local = basePrefix;
  basePrefix_local = sourceFile;
  sourceFile_local = &this->ConfigSuffix;
  this_local = (cmQtAutoGenerators *)__return_storage_ptr__;
  cmFilePathChecksum::getPart(__return_storage_ptr__,&this->FPathChecksum,sourceFile,10);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)baseSuffix_local);
  cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_68,basePrefix_local);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGenerators::ChecksumedPath(
  const std::string& sourceFile, const std::string& basePrefix,
  const std::string& baseSuffix) const
{
  std::string res = FPathChecksum.getPart(sourceFile);
  res += "/";
  res += basePrefix;
  res += cmsys::SystemTools::GetFilenameWithoutLastExtension(sourceFile);
  res += baseSuffix;
  return res;
}